

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O1

bool __thiscall Pig::getDecimal(Pig *this,string *result)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  size_type sVar4;
  long *local_40 [2];
  long local_30 [2];
  
  sVar4 = this->_cursor;
  pcVar2 = (((this->_text).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_M_dataplus)._M_p;
  cVar1 = pcVar2[sVar4];
  if ((cVar1 == '-') || (cVar1 == '+')) {
    sVar4 = sVar4 + 1;
  }
  cVar1 = pcVar2[sVar4];
  if ((cVar1 == '\0') || (bVar3 = unicodeLatinDigit((int)cVar1), !bVar3)) {
    bVar3 = false;
  }
  else {
    do {
      sVar4 = sVar4 + 1;
      cVar1 = (((this->_text).
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_dataplus)._M_p[sVar4];
      if (cVar1 == '\0') break;
      bVar3 = unicodeLatinDigit((int)cVar1);
    } while (bVar3);
    if ((((this->_text).
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_M_dataplus)._M_p[sVar4] == '.') {
      do {
        cVar1 = (((this->_text).
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->_M_dataplus)._M_p[sVar4 + 1];
        sVar4 = sVar4 + 1;
        if (cVar1 == '\0') break;
        bVar3 = unicodeLatinDigit((int)cVar1);
      } while (bVar3);
    }
    std::__cxx11::string::substr
              ((ulong)local_40,
               (ulong)(this->_text).
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
    std::__cxx11::string::operator=((string *)result,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    this->_cursor = sVar4;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Pig::getDecimal (std::string& result)
{
  auto i = _cursor;

  // [+-]?
  if ((*_text)[i] &&
      ((*_text)[i] == '-' ||
       (*_text)[i] == '+'))
    ++i;

  // digit+
  if ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
  {
    ++i;

    while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
      ++i;

    // ( . digit+ )?
    if ((*_text)[i] && (*_text)[i] == '.')
    {
      ++i;

      while ((*_text)[i] && unicodeLatinDigit ((*_text)[i]))
        ++i;
    }

    result = _text->substr (_cursor, i - _cursor);
    _cursor = i;
    return true;
  }

  return false;
}